

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_verify(secp256k1_ge *a)

{
  secp256k1_fe *psVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined8 uVar113;
  secp256k1_fe *psVar114;
  secp256k1_fe *a_00;
  secp256k1_fe *psVar115;
  ulong uVar116;
  ulong uVar117;
  ulong uVar118;
  undefined8 unaff_RBP;
  secp256k1_fe *psVar119;
  ulong uVar120;
  secp256k1_fe *psVar121;
  secp256k1_ge *psVar122;
  secp256k1_ge *a_01;
  secp256k1_ge *psVar123;
  secp256k1_fe *a_02;
  secp256k1_fe *psVar124;
  secp256k1_fe *psVar125;
  secp256k1_ge *psVar126;
  secp256k1_ge *r;
  secp256k1_ge *a_03;
  undefined8 unaff_R12;
  ulong uVar127;
  ulong unaff_R13;
  undefined8 uVar128;
  undefined1 auStack_200 [56];
  uint64_t uStack_1c8;
  uint64_t uStack_1c0;
  uint64_t uStack_1b8;
  uint64_t uStack_1b0;
  undefined8 uStack_1a8;
  int iStack_1a4;
  secp256k1_fe *psStack_1a0;
  secp256k1_ge *psStack_198;
  code *pcStack_190;
  secp256k1_ge_storage sStack_188;
  undefined8 uStack_148;
  code *pcStack_138;
  ulong uStack_128;
  ulong uStack_120;
  ulong uStack_118;
  secp256k1_ge *psStack_110;
  ulong uStack_108;
  secp256k1_fe *psStack_100;
  ulong uStack_f8;
  secp256k1_fe *psStack_f0;
  secp256k1_fe *psStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  secp256k1_fe *psStack_d0;
  undefined1 auStack_c8 [16];
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  secp256k1_fe *psStack_a0;
  undefined1 auStack_98 [16];
  secp256k1_fe *psStack_88;
  secp256k1_fe *psStack_80;
  ulong uStack_78;
  secp256k1_fe *psStack_70;
  secp256k1_fe *psStack_68;
  long lStack_60;
  ulong uStack_58;
  secp256k1_ge *psStack_50;
  
  auVar98._8_8_ = unaff_R12;
  auVar98._0_8_ = unaff_RBP;
  secp256k1_fe_verify(&a->x);
  psVar125 = &a->y;
  secp256k1_fe_verify(psVar125);
  secp256k1_fe_verify_magnitude(&a->x,4);
  psVar119 = (secp256k1_fe *)0x3;
  a_02 = psVar125;
  secp256k1_fe_verify_magnitude(psVar125,3);
  if ((uint)a->infinity < 2) {
    return;
  }
  secp256k1_ge_verify_cold_1();
  if ((int)psVar119 < 0) {
    secp256k1_fe_verify_magnitude_cold_2();
  }
  else if (a_02->magnitude <= (int)psVar119) {
    return;
  }
  secp256k1_fe_verify_magnitude_cold_1();
  auStack_98._8_8_ = 0x149702;
  psStack_50 = a;
  secp256k1_fe_verify(psVar119);
  uVar120 = 8;
  auStack_98._8_8_ = 0x14970f;
  psVar115 = psVar119;
  secp256k1_fe_verify_magnitude(psVar119,8);
  psVar121 = (secp256k1_fe *)psVar119->n[0];
  if ((ulong)psVar121 >> 0x38 == 0) {
    psVar115 = (secp256k1_fe *)psVar119->n[1];
    if ((secp256k1_fe *)0xffffffffffffff < psVar115) goto LAB_00149ae4;
    psVar125 = (secp256k1_fe *)psVar119->n[2];
    if ((secp256k1_fe *)0xffffffffffffff < psVar125) goto LAB_00149ae9;
    psVar1 = (secp256k1_fe *)psVar119->n[3];
    if ((secp256k1_fe *)0xffffffffffffff < psVar1) goto LAB_00149aee;
    uVar127 = psVar119->n[4];
    if (uVar127 >> 0x34 != 0) goto LAB_00149af3;
    uStack_58 = (long)psVar121 * 2;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = psVar1;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uStack_58;
    uVar120 = (long)psVar115 * 2;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = psVar125;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar120;
    auVar98 = auVar4 * auVar55 + auVar3 * auVar54;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar127;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar127;
    psVar114 = SUB168(auVar5 * auVar56,8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = SUB168(auVar5 * auVar56,0);
    auVar3 = auVar98 + auVar6 * ZEXT816(0x1000003d10);
    unaff_R13 = auVar3._8_8_;
    psVar119 = psVar121;
    if (unaff_R13 >> 0x33 != 0) goto LAB_00149af8;
    auVar111 = auVar3 >> 0x34;
    psVar124 = auVar111._0_8_;
    uStack_78 = uVar127 * 2;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uStack_78;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = psVar121;
    auVar94 = auVar7 * auVar57;
    uVar113 = auVar94._0_8_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = psVar1;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar120;
    psVar119 = SUB168(auVar8 * auVar58,8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = psVar125;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = psVar125;
    auVar98 = auVar94 + auVar9 * auVar59 + auVar8 * auVar58;
    uVar127 = SUB168(auVar98 + (auVar3 >> 0x34),8);
    psStack_88 = psVar114;
    psStack_80 = psVar121;
    psStack_70 = a_02;
    psStack_68 = psVar115;
    if (0x7ffffffffffff < uVar127) goto LAB_00149afd;
    lStack_60 = 0x7ffffffffffff;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = psVar114;
    auVar98 = auVar10 * ZEXT816(0x1000003d10000) + auVar98 + (auVar3 >> 0x34);
    auVar112 = auVar98 >> 0x34;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uStack_78;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = psVar115;
    auVar94._8_8_ = SUB168(auVar11 * auVar60,8);
    auVar94._0_8_ = uVar113;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = psVar1;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = (long)psVar125 * 2;
    auVar99 = auVar12 * auVar61 + auVar11 * auVar60 + (auVar98 >> 0x34);
    psVar119 = psVar125;
    if (auVar99._8_8_ >> 0x32 != 0) goto LAB_00149b02;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = psVar121;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = psVar121;
    uVar120 = auVar99._8_8_ >> 0x34;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (auVar99._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar98._6_2_ & 0xf);
    auVar100 = auVar14 * ZEXT816(0x1000003d1) + auVar13 * auVar62;
    psVar124 = (secp256k1_fe *)(auVar100._0_8_ & 0xfffffffffffff);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uStack_78;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = psVar125;
    auVar94._8_8_ = SUB168(auVar15 * auVar63,8);
    auVar94._0_8_ = SUB168(auVar13 * auVar62,0);
    a_02->n[0] = (uint64_t)psVar124;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = psVar1;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = psVar1;
    psVar121 = (secp256k1_fe *)0x3ffffffffffff;
    auVar4 = auVar16 * auVar64 + auVar15 * auVar63 + (auVar99 >> 0x34);
    psVar119 = auVar4._0_8_;
    psStack_88 = psVar125;
    psStack_80 = psVar1;
    if (0x3ffffffffffff < auVar4._8_8_) goto LAB_00149b07;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = psVar115;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uStack_58;
    uVar113 = SUB168(auVar17 * auVar65,8);
    auVar100 = auVar100 >> 0x34;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (ulong)psVar119 & 0xfffffffffffff;
    auVar101 = auVar18 * ZEXT816(0x1000003d10) + auVar17 * auVar65 + auVar100;
    lStack_60 = 0x7ffffffffffff - auVar101._8_8_;
    psVar124 = psVar115;
    if (0x7ffffffffffff < auVar101._8_8_) goto LAB_00149b0c;
    uVar128 = SUB168(auVar101 >> 0x34,0);
    uVar127 = auVar101._0_8_ & 0xfffffffffffff;
    auVar104._8_8_ = SUB168(auVar101 >> 0x34,8);
    auVar104._0_8_ = uVar127;
    auVar6 = auVar101 >> 0x34;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = psVar125;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uStack_58;
    auVar95 = auVar19 * auVar66;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = psVar115;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = psVar115;
    auVar5 = auVar20 * auVar67 + auVar95;
    uVar120 = SUB168(auVar5 + auVar6,8);
    a_02->n[1] = uVar127;
    psVar121 = (secp256k1_fe *)(0x3ffffffffffff - uVar120);
    auVar101 = auVar104;
    if (0x3ffffffffffff < uVar120) goto LAB_00149b11;
    psVar119 = (secp256k1_fe *)((ulong)psVar119 >> 0x34 | auVar4._8_8_ << 0xc);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uStack_78;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = psVar1;
    auVar4 = auVar21 * auVar68 + (auVar4 >> 0x34);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = auVar4._0_8_;
    auVar5 = auVar22 * ZEXT816(0x1000003d10) + auVar5 + auVar6;
    a_02->n[2] = auVar5._0_8_ & 0xfffffffffffff;
    auVar5 = auVar5 >> 0x34;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = auVar5._0_8_;
    psVar121 = auVar5._8_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar4._8_8_;
    auVar102._8_8_ = psVar121;
    auVar102._0_8_ = auVar3._0_8_ & 0xffffffffffffe;
    auVar103 = auVar23 * ZEXT816(0x1000003d10000) + auVar102 + auVar103;
    uVar120 = auVar103._0_8_;
    uVar127 = auVar103._8_8_;
    if (uVar127 >> 0x24 != 0) goto LAB_00149b16;
    a_02->n[3] = uVar120 & 0xfffffffffffff;
    uVar120 = (uVar127 << 0xc | uVar120 >> 0x34) + (auVar98._0_8_ & 0xffffffffffff);
    a_02->n[4] = uVar120;
    if (uVar120 >> 0x31 == 0) {
      a_02->magnitude = 1;
      a_02->normalized = 0;
      secp256k1_fe_verify(a_02);
      return;
    }
  }
  else {
    auStack_98._8_8_ = 0x149ae4;
    secp256k1_fe_sqr_cold_13();
LAB_00149ae4:
    auStack_98._8_8_ = 0x149ae9;
    secp256k1_fe_sqr_cold_12();
LAB_00149ae9:
    auStack_98._8_8_ = 0x149aee;
    secp256k1_fe_sqr_cold_11();
LAB_00149aee:
    auStack_98._8_8_ = 0x149af3;
    secp256k1_fe_sqr_cold_10();
LAB_00149af3:
    auStack_98._8_8_ = 0x149af8;
    secp256k1_fe_sqr_cold_9();
LAB_00149af8:
    uVar127 = auVar98._8_8_;
    auVar94._8_8_ = a_02;
    auVar94._0_8_ = auVar98._0_8_;
    auStack_98._8_8_ = 0x149afd;
    secp256k1_fe_sqr_cold_8();
    auVar111._8_8_ = unaff_R13;
    auVar111._0_8_ = psVar115;
LAB_00149afd:
    psVar124 = auVar111._0_8_;
    auVar99._8_8_ = psVar119;
    auVar99._0_8_ = auVar111._8_8_;
    auStack_98._8_8_ = 0x149b02;
    secp256k1_fe_sqr_cold_7();
    auVar112._8_8_ = uVar120;
    auVar112._0_8_ = uVar127;
    psVar119 = psVar125;
LAB_00149b02:
    psVar121 = auVar112._8_8_;
    uVar120 = auVar99._8_8_;
    auVar100._8_8_ = auVar112._0_8_;
    auVar100._0_8_ = auVar99._0_8_;
    auStack_98._8_8_ = 0x149b07;
    secp256k1_fe_sqr_cold_6();
LAB_00149b07:
    uVar113 = auVar94._8_8_;
    auVar101._8_8_ = auVar94._0_8_;
    auVar101._0_8_ = uVar120;
    auStack_98._8_8_ = 0x149b0c;
    secp256k1_fe_sqr_cold_5();
LAB_00149b0c:
    a_02 = psVar124;
    uVar128 = auVar100._0_8_;
    auVar95._8_8_ = uVar113;
    auVar95._0_8_ = auVar100._8_8_;
    auStack_98._8_8_ = 0x149b11;
    secp256k1_fe_sqr_cold_4();
LAB_00149b11:
    auStack_98._8_8_ = 0x149b16;
    secp256k1_fe_sqr_cold_3();
LAB_00149b16:
    auStack_98._8_8_ = 0x149b1b;
    secp256k1_fe_sqr_cold_2();
  }
  uVar120 = auVar101._8_8_;
  uVar127 = auVar101._0_8_;
  auStack_98._8_8_ = secp256k1_fe_mul;
  secp256k1_fe_sqr_cold_1();
  pcStack_138 = (code *)0x149b3f;
  uStack_b8 = auVar95._8_8_;
  uStack_b0 = auVar95._0_8_;
  uStack_a8 = uVar128;
  psStack_a0 = psVar119;
  auStack_98 = auVar101;
  secp256k1_fe_verify(psVar121);
  pcStack_138 = (code *)0x149b47;
  secp256k1_fe_verify(a_00);
  pcStack_138 = (code *)0x149b54;
  secp256k1_fe_verify_magnitude(psVar121,8);
  psVar122 = (secp256k1_ge *)0x8;
  pcStack_138 = (code *)0x149b61;
  psVar125 = a_00;
  secp256k1_fe_verify_magnitude(a_00,8);
  if (a_02 == a_00) {
    pcStack_138 = (code *)0x14a05b;
    secp256k1_fe_mul_cold_21();
LAB_0014a05b:
    pcStack_138 = (code *)0x14a060;
    secp256k1_fe_mul_cold_20();
LAB_0014a060:
    pcStack_138 = (code *)0x14a065;
    secp256k1_fe_mul_cold_19();
LAB_0014a065:
    pcStack_138 = (code *)0x14a06a;
    secp256k1_fe_mul_cold_18();
LAB_0014a06a:
    pcStack_138 = (code *)0x14a06f;
    secp256k1_fe_mul_cold_17();
LAB_0014a06f:
    pcStack_138 = (code *)0x14a074;
    secp256k1_fe_mul_cold_16();
LAB_0014a074:
    pcStack_138 = (code *)0x14a079;
    secp256k1_fe_mul_cold_15();
LAB_0014a079:
    pcStack_138 = (code *)0x14a07e;
    secp256k1_fe_mul_cold_14();
LAB_0014a07e:
    pcStack_138 = (code *)0x14a083;
    secp256k1_fe_mul_cold_13();
LAB_0014a083:
    pcStack_138 = (code *)0x14a088;
    secp256k1_fe_mul_cold_12();
LAB_0014a088:
    pcStack_138 = (code *)0x14a08d;
    secp256k1_fe_mul_cold_11();
    a_01 = psVar122;
LAB_0014a08d:
    psVar119 = psVar121;
    pcStack_138 = (code *)0x14a092;
    secp256k1_fe_mul_cold_10();
    auVar96._8_8_ = uVar120;
    auVar96._0_8_ = psVar125;
LAB_0014a092:
    auVar97._8_8_ = psVar119;
    auVar97._0_8_ = auVar96._8_8_;
    psVar115 = auVar96._0_8_;
    pcStack_138 = (code *)0x14a097;
    secp256k1_fe_mul_cold_9();
LAB_0014a097:
    pcStack_138 = (code *)0x14a09c;
    secp256k1_fe_mul_cold_8();
LAB_0014a09c:
    a_02 = psVar115;
    pcStack_138 = (code *)0x14a0a1;
    secp256k1_fe_mul_cold_7();
LAB_0014a0a1:
    pcStack_138 = (code *)0x14a0a6;
    secp256k1_fe_mul_cold_6();
LAB_0014a0a6:
    pcStack_138 = (code *)0x14a0ab;
    secp256k1_fe_mul_cold_5();
LAB_0014a0ab:
    pcStack_138 = (code *)0x14a0b0;
    secp256k1_fe_mul_cold_4();
LAB_0014a0b0:
    pcStack_138 = (code *)0x14a0b5;
    secp256k1_fe_mul_cold_3();
LAB_0014a0b5:
    pcStack_138 = (code *)0x14a0ba;
    secp256k1_fe_mul_cold_2();
  }
  else {
    if (psVar121 == a_00) goto LAB_0014a05b;
    psVar119 = (secp256k1_fe *)psVar121->n[0];
    if ((ulong)psVar119 >> 0x38 != 0) goto LAB_0014a060;
    uVar127 = 0xffffffffffffff;
    uVar118 = psVar121->n[1];
    if (0xffffffffffffff < uVar118) goto LAB_0014a065;
    psVar122 = (secp256k1_ge *)psVar121->n[2];
    if ((secp256k1_ge *)0xffffffffffffff < psVar122) goto LAB_0014a06a;
    uVar2 = psVar121->n[3];
    if (0xffffffffffffff < uVar2) goto LAB_0014a06f;
    uStack_108 = psVar121->n[4];
    if (uStack_108 >> 0x34 != 0) goto LAB_0014a074;
    uVar117 = a_00->n[0];
    if (0xffffffffffffff < uVar117) goto LAB_0014a079;
    psVar121 = (secp256k1_fe *)a_00->n[1];
    if ((secp256k1_fe *)0xffffffffffffff < psVar121) goto LAB_0014a07e;
    uVar116 = a_00->n[2];
    if (0xffffffffffffff < uVar116) goto LAB_0014a083;
    psVar125 = (secp256k1_fe *)a_00->n[3];
    if ((secp256k1_fe *)0xffffffffffffff < psVar125) goto LAB_0014a088;
    uVar120 = a_00->n[4];
    a_01 = psVar122;
    if (0xfffffffffffff < uVar120) goto LAB_0014a08d;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = psVar125;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = psVar119;
    auVar96 = auVar24 * auVar69;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar116;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar118;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = psVar121;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = psVar122;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar117;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar2;
    auVar98 = auVar96 + auVar25 * auVar70 + auVar27 * auVar72 + auVar26 * auVar71;
    a_01 = auVar98._8_8_;
    uStack_128 = uVar116;
    uStack_120 = uVar120;
    uStack_118 = uVar118;
    psStack_110 = psVar122;
    uStack_f8 = uVar117;
    psStack_f0 = psVar121;
    psStack_e8 = psVar125;
    psStack_d0 = a_02;
    if ((ulong)a_01 >> 0x32 != 0) goto LAB_0014a092;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar120;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uStack_108;
    uStack_d8 = SUB168(auVar28 * auVar73,8);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = SUB168(auVar28 * auVar73,0);
    auVar98 = auVar98 + auVar29 * ZEXT816(0x1000003d10);
    uStack_e0 = auVar98._0_8_;
    auVar98 = auVar98 >> 0x34;
    auStack_c8._8_8_ = 0;
    auStack_c8._0_8_ = uVar120;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = psVar119;
    auStack_c8 = auStack_c8 * auVar74;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = psVar125;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar118;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar116;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = psVar122;
    auVar97 = auVar31 * auVar76;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = psVar121;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar2;
    psVar115 = SUB168(auVar32 * auVar77,8);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar117;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uStack_108;
    auVar3 = auVar30 * auVar75 + auVar97 + auVar33 * auVar78 + auVar32 * auVar77;
    auVar4 = auStack_c8 + auVar3;
    a_01 = (secp256k1_ge *)
           (auVar4._8_8_ + auVar98._8_8_ + (ulong)CARRY8(auVar4._0_8_,auVar98._0_8_));
    psStack_100 = psVar119;
    if ((ulong)a_01 >> 0x33 != 0) goto LAB_0014a097;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uStack_d8;
    auVar98 = auVar34 * ZEXT816(0x1000003d10000) + auVar98 + auVar3 + auStack_c8;
    auVar3 = auVar98 >> 0x34;
    a_01 = auVar3._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar120;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar118;
    uStack_120 = SUB168(auVar35 * auVar79,8);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = psVar125;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = psVar122;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar116;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar2;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = psVar121;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uStack_108;
    auVar4 = auVar3 + auVar36 * auVar80 + auVar38 * auVar82 + auVar37 * auVar81 + auVar35 * auVar79;
    uVar116 = auVar4._0_8_;
    auVar97._8_8_ = uVar116;
    auVar97._0_8_ = auVar3._8_8_;
    uVar120 = auVar4._8_8_;
    psVar115 = SUB168(auVar36 * auVar80,0);
    uStack_128 = uVar2;
    if (0x3ffffffffffff < uVar120) goto LAB_0014a09c;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar117;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = psVar119;
    uVar127 = uVar116 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar98._6_2_ & 0xf);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar127;
    auVar3 = auVar39 * auVar83 + auVar40 * ZEXT816(0x1000003d1);
    a_02->n[0] = auVar3._0_8_ & 0xfffffffffffff;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = psVar119;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = a_00->n[1];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar118;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = a_00->n[0];
    auVar3 = auVar41 * auVar84 + (auVar3 >> 0x34) + auVar42 * auVar85;
    a_01 = auVar3._8_8_;
    if ((secp256k1_ge *)0x3ffffffffffff < a_01) goto LAB_0014a0a1;
    auVar105._8_8_ = uVar120 >> 0x34;
    auVar105._0_8_ = uVar116 >> 0x34 | uVar120 << 0xc;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = psVar122;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = a_00->n[4];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar2;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = a_00->n[3];
    auVar4 = auVar43 * auVar86 + auVar105 + auVar44 * auVar87;
    uVar127 = auVar4._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uStack_108;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = a_00->n[2];
    auVar4 = auVar4 + auVar45 * auVar88;
    uVar117 = auVar4._0_8_;
    auVar97._8_8_ = uVar117;
    auVar97._0_8_ = uStack_108;
    uVar120 = auVar4._8_8_;
    if (0x3ffffffffffff < uVar120) goto LAB_0014a0a6;
    uVar127 = 0xfffffffffffff;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar117 & 0xfffffffffffff;
    auVar3 = auVar3 + auVar46 * ZEXT816(0x1000003d10);
    a_02->n[1] = auVar3._0_8_ & 0xfffffffffffff;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = psVar119;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = a_00->n[2];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar118;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = a_00->n[1];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = psVar122;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = a_00->n[0];
    auVar3 = auVar48 * auVar90 + auVar47 * auVar89 + (auVar3 >> 0x34) + auVar49 * auVar91;
    a_01 = auVar3._8_8_;
    if ((secp256k1_ge *)0x3ffffffffffff < a_01) goto LAB_0014a0ab;
    uVar118 = uVar117 >> 0x34 | uVar120 << 0xc;
    auVar110._8_8_ = uVar118;
    auVar110._0_8_ = uStack_108;
    auVar109._8_8_ = uVar118;
    auVar109._0_8_ = uStack_108;
    auVar97._8_8_ = uVar118;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar2;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = a_00->n[4];
    auVar106._8_8_ = uVar120 >> 0x34;
    auVar106._0_8_ = uVar118;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uStack_108;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = a_00->n[3];
    auVar4 = auVar50 * auVar92 + auVar106 + auVar51 * auVar93;
    uVar120 = auVar4._8_8_;
    if (0x3ffffffffffff < uVar120) goto LAB_0014a0b0;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = auVar4._0_8_;
    auVar3 = auVar3 + auVar52 * ZEXT816(0x1000003d10);
    auVar4 = auVar3 >> 0x34;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = auVar4._0_8_;
    a_02->n[2] = auVar3._0_8_ & 0xfffffffffffff;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar120;
    a_01 = auVar4._8_8_;
    auVar107._8_8_ = a_01;
    auVar107._0_8_ = uStack_e0 & 0xfffffffffffff;
    auVar108 = auVar53 * ZEXT816(0x1000003d10000) + auVar107 + auVar108;
    uVar120 = auVar108._0_8_;
    uVar118 = auVar108._8_8_;
    auVar97 = auVar109;
    if (uVar118 >> 0x24 != 0) goto LAB_0014a0b5;
    uVar127 = uVar120 & 0xfffffffffffff;
    a_02->n[3] = uVar127;
    uVar120 = (uVar118 << 0xc | uVar120 >> 0x34) + (auVar98._0_8_ & 0xffffffffffff);
    a_02->n[4] = uVar120;
    auVar97 = auVar110;
    if (uVar120 >> 0x31 == 0) {
      a_02->magnitude = 1;
      a_02->normalized = 0;
      secp256k1_fe_verify(a_02);
      return;
    }
  }
  pcStack_138 = secp256k1_ge_to_bytes;
  secp256k1_fe_mul_cold_1();
  pcStack_190 = (code *)0x14a0d6;
  psVar122 = a_01;
  psVar126 = a_01;
  uStack_148 = auVar97._8_8_;
  pcStack_138 = (code *)uVar127;
  secp256k1_ge_verify(a_01);
  if (a_01->infinity == 0) {
    pcStack_190 = (code *)0x14a0eb;
    secp256k1_ge_to_storage(&sStack_188,a_01);
    a_02[1].n[0] = sStack_188.y.n[2];
    a_02[1].n[1] = sStack_188.y.n[3];
    a_02->n[4] = sStack_188.y.n[0];
    a_02->magnitude = (undefined4)sStack_188.y.n[1];
    a_02->normalized = sStack_188.y.n[1]._4_4_;
    a_02->n[2] = sStack_188.x.n[2];
    a_02->n[3] = sStack_188.x.n[3];
    a_02->n[0] = sStack_188.x.n[0];
    a_02->n[1] = sStack_188.x.n[1];
    return;
  }
  pcStack_190 = secp256k1_ge_to_storage;
  secp256k1_ge_to_bytes_cold_1();
  a_03 = (secp256k1_ge *)auStack_200;
  psVar123 = psVar122;
  r = psVar122;
  psStack_1a0 = a_02;
  psStack_198 = a_01;
  pcStack_190 = (code *)uVar127;
  secp256k1_ge_verify(psVar122);
  if (psVar122->infinity == 0) {
    auStack_200._48_8_ = (psVar122->x).n[0];
    uStack_1c8 = (psVar122->x).n[1];
    uStack_1c0 = (psVar122->x).n[2];
    uStack_1b8 = (psVar122->x).n[3];
    uStack_1b0 = (psVar122->x).n[4];
    uStack_1a8._0_4_ = (psVar122->x).magnitude;
    iStack_1a4 = (psVar122->x).normalized;
    r = (secp256k1_ge *)(auStack_200 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)r);
    auStack_200._0_8_ = (psVar122->y).n[0];
    auStack_200._8_8_ = (psVar122->y).n[1];
    auStack_200._16_8_ = (psVar122->y).n[2];
    auStack_200._24_8_ = (psVar122->y).n[3];
    auStack_200._32_8_ = (psVar122->y).n[4];
    auStack_200._40_4_ = (psVar122->y).magnitude;
    auStack_200._44_4_ = (psVar122->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_200);
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (iStack_1a4 != 0) {
      (psVar126->x).n[0] = uStack_1c8 << 0x34 | auStack_200._48_8_;
      (psVar126->x).n[1] = uStack_1c0 << 0x28 | uStack_1c8 >> 0xc;
      (psVar126->x).n[2] = uStack_1b8 << 0x1c | uStack_1c0 >> 0x18;
      (psVar126->x).n[3] = uStack_1b0 << 0x10 | uStack_1b8 >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_200);
      if (auStack_200._44_4_ != 0) {
        (psVar126->x).n[4] = auStack_200._8_8_ << 0x34 | auStack_200._0_8_;
        uVar120 = auStack_200._16_8_ << 0x28 | (ulong)auStack_200._8_8_ >> 0xc;
        (psVar126->x).magnitude = (int)uVar120;
        (psVar126->x).normalized = (int)(uVar120 >> 0x20);
        (psVar126->y).n[0] = auStack_200._24_8_ << 0x1c | (ulong)auStack_200._16_8_ >> 0x18;
        (psVar126->y).n[1] = auStack_200._32_8_ << 0x10 | (ulong)auStack_200._24_8_ >> 0x24;
        return;
      }
      goto LAB_0014a26e;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_03 = r;
  secp256k1_ge_to_storage_cold_3();
LAB_0014a26e:
  secp256k1_ge_to_storage_cold_2();
  (a_03->x).n[0] = (psVar123->x).n[0] & 0xfffffffffffff;
  (a_03->x).n[1] = ((psVar123->x).n[1] & 0xffffffffff) << 0xc | (psVar123->x).n[0] >> 0x34;
  (a_03->x).n[2] = ((psVar123->x).n[2] & 0xfffffff) << 0x18 | (psVar123->x).n[1] >> 0x28;
  (a_03->x).n[3] = ((psVar123->x).n[3] & 0xffff) << 0x24 | (psVar123->x).n[2] >> 0x1c;
  (a_03->x).n[4] = (psVar123->x).n[3] >> 0x10;
  (a_03->x).magnitude = 1;
  (a_03->x).normalized = 1;
  secp256k1_fe_verify(&a_03->x);
  (a_03->y).n[0] = (psVar123->x).n[4] & 0xfffffffffffff;
  uVar120._0_4_ = (psVar123->x).magnitude;
  uVar120._4_4_ = (psVar123->x).normalized;
  (a_03->y).n[1] = (uVar120 & 0xffffffffff) << 0xc | (psVar123->x).n[4] >> 0x34;
  uVar127._0_4_ = (psVar123->x).magnitude;
  uVar127._4_4_ = (psVar123->x).normalized;
  (a_03->y).n[2] = ((psVar123->y).n[0] & 0xfffffff) << 0x18 | uVar127 >> 0x28;
  (a_03->y).n[3] = ((psVar123->y).n[1] & 0xffff) << 0x24 | (psVar123->y).n[0] >> 0x1c;
  (a_03->y).n[4] = (psVar123->y).n[1] >> 0x10;
  (a_03->y).magnitude = 1;
  (a_03->y).normalized = 1;
  secp256k1_fe_verify(&a_03->y);
  a_03->infinity = 0;
  secp256k1_ge_verify(a_03);
  return;
}

Assistant:

static void secp256k1_ge_verify(const secp256k1_ge *a) {
    SECP256K1_FE_VERIFY(&a->x);
    SECP256K1_FE_VERIFY(&a->y);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->x, SECP256K1_GE_X_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->y, SECP256K1_GE_Y_MAGNITUDE_MAX);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
    (void)a;
}